

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void avx::RgbToBgr(uint8_t *outY,uint8_t *inY,uint8_t *outYEnd,uint32_t rowSizeOut,
                  uint32_t rowSizeIn,uint8_t colorCount,uint32_t simdWidth,uint32_t totalSimdWidth,
                  uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint in_ECX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  undefined1 in_DIL;
  undefined7 in_register_00000039;
  uint in_R8D;
  byte in_R9B;
  undefined1 auVar4 [16];
  uint in_stack_00000008;
  simd *dst;
  simd *src;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  simd ctrl;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 *local_1b0;
  undefined1 (*local_1a8) [32];
  undefined1 (*local_158) [32];
  undefined8 *local_150;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  
  local_150 = (undefined8 *)CONCAT71(in_register_00000039,in_DIL);
  local_158 = (undefined1 (*) [32])CONCAT71(in_register_00000031,in_SIL);
  auVar1 = vpinsrb_avx(ZEXT116(0x10),0x11,1);
  auVar1 = vpinsrb_avx(auVar1,0x14,2);
  auVar1 = vpinsrb_avx(auVar1,0x13,3);
  auVar1 = vpinsrb_avx(auVar1,0x12,4);
  auVar1 = vpinsrb_avx(auVar1,0x17,5);
  auVar1 = vpinsrb_avx(auVar1,0x16,6);
  auVar1 = vpinsrb_avx(auVar1,0x15,7);
  auVar1 = vpinsrb_avx(auVar1,0x1a,8);
  auVar1 = vpinsrb_avx(auVar1,0x19,9);
  auVar1 = vpinsrb_avx(auVar1,0x18,10);
  auVar1 = vpinsrb_avx(auVar1,0x1d,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x1c,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x1b,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x1e,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x1f,0xf);
  auVar2 = vpinsrb_avx(ZEXT116(2),1,1);
  auVar2 = vpinsrb_avx(auVar2,0,2);
  auVar2 = vpinsrb_avx(auVar2,5,3);
  auVar2 = vpinsrb_avx(auVar2,4,4);
  auVar2 = vpinsrb_avx(auVar2,3,5);
  auVar2 = vpinsrb_avx(auVar2,8,6);
  auVar2 = vpinsrb_avx(auVar2,7,7);
  auVar2 = vpinsrb_avx(auVar2,6,8);
  auVar2 = vpinsrb_avx(auVar2,0xb,9);
  auVar2 = vpinsrb_avx(auVar2,10,10);
  auVar2 = vpinsrb_avx(auVar2,9,0xb);
  auVar2 = vpinsrb_avx(auVar2,0xe,0xc);
  auVar2 = vpinsrb_avx(auVar2,0xd,0xd);
  auVar2 = vpinsrb_avx(auVar2,0xc,0xe);
  auVar2 = vpinsrb_avx(auVar2,0xf,0xf);
  auVar4 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_d0 = auVar4._0_8_;
  uStack_c8 = auVar4._8_8_;
  for (; local_150 != (undefined8 *)CONCAT71(in_register_00000011,in_DL);
      local_150 = (undefined8 *)((long)local_150 + (ulong)in_ECX)) {
    local_1a8 = local_158;
    for (local_1b0 = local_150; local_1b0 != (undefined8 *)((long)local_150 + (ulong)simdWidth);
        local_1b0 = (undefined8 *)((long)local_1b0 + (ulong)in_stack_00000008)) {
      auVar3._16_8_ = uStack_d0;
      auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar3._24_8_ = uStack_c8;
      auVar3 = vpshufb_avx2(*local_1a8,auVar3);
      local_200 = auVar3._0_8_;
      uStack_1f8 = auVar3._8_8_;
      uStack_1f0 = auVar3._16_8_;
      uStack_1e8 = auVar3._24_8_;
      *local_1b0 = local_200;
      local_1b0[1] = uStack_1f8;
      local_1b0[2] = uStack_1f0;
      local_1b0[3] = uStack_1e8;
      *(undefined1 *)((long)local_1b0 + 0xf) = (*local_1a8)[0x11];
      *(undefined1 *)((long)local_1b0 + 0x11) = (*local_1a8)[0xf];
      local_1a8 = (undefined1 (*) [32])(*local_1a8 + in_stack_00000008);
    }
    if (totalSimdWidth != 0) {
      for (; local_1b0 !=
             (undefined8 *)((long)((long)local_150 + (ulong)simdWidth) + (ulong)totalSimdWidth);
          local_1b0 = (undefined8 *)((long)local_1b0 + (long)(int)(uint)in_R9B)) {
        *(undefined1 *)((long)local_1b0 + 2) = (*local_1a8)[0];
        *(undefined1 *)((long)local_1b0 + 1) = (*local_1a8)[1];
        *(undefined1 *)local_1b0 = (*local_1a8)[2];
        local_1a8 = (undefined1 (*) [32])(*local_1a8 + (int)(uint)in_R9B);
      }
    }
    local_158 = (undefined1 (*) [32])(*local_158 + in_R8D);
  }
  return;
}

Assistant:

void RgbToBgr( uint8_t * outY, const uint8_t * inY, const uint8_t * outYEnd, uint32_t rowSizeOut, uint32_t rowSizeIn, 
                   const uint8_t colorCount, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        const simd ctrl = _mm256_setr_epi8(2, 1, 0, 5, 4, 3, 8, 7, 6, 11, 10, 9, 14, 13, 12, 15, 
                                           16, 17, 20, 19, 18, 23, 22, 21, 26, 25, 24, 29, 28, 27, 30, 31);
        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + totalSimdWidth;

            for( ; outX != outXEnd; outX += simdWidth, inX += simdWidth ) {
                const simd * src = reinterpret_cast<const simd*> (inX);
                simd * dst = reinterpret_cast<simd*> (outX);
                simd result = _mm256_loadu_si256( src );
                result = _mm256_shuffle_epi8( result, ctrl );
                _mm256_storeu_si256( dst, result );
                *(outX + 15) = *(inX + 17);
                *(outX + 17) = *(inX + 15);
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * outXEndNonSimd = outXEnd + nonSimdWidth;
                for( ; outX != outXEndNonSimd; outX += colorCount, inX += colorCount ) {
                    *(outX + 2) = *(inX);
                    *(outX + 1) = *(inX + 1);
                    *(outX) = *(inX + 2);
                }
            }
        }
    }